

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

Sign anon_unknown.dwarf_5db41::side3_exact_SOS
               (double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2,
               coord_index_t dim)

{
  uint uVar1;
  index_t iVar2;
  index_t iVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  expansion *peVar7;
  expansion *peVar8;
  expansion *peVar9;
  expansion *a;
  expansion *a_00;
  expansion *a_01;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uchar *sig;
  ulong uVar13;
  uchar *sig_00;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar14;
  index_t iVar15;
  expansion *peVar16;
  expansion *peVar17;
  expansion *peVar18;
  expansion *this;
  expansion *this_00;
  expansion *this_01;
  ulong uVar19;
  expansion *peVar20;
  long lVar21;
  expansion *peVar22;
  expansion *peVar23;
  expansion *this_02;
  double dStack_9100;
  index_t aiStack_90f8 [3062];
  double dStack_6120;
  index_t aiStack_6118 [3062];
  undefined8 uStack_3140;
  index_t aiStack_3138 [3062];
  double dStack_160;
  string local_158;
  undefined1 local_138 [8];
  double *p_sort [4];
  allocator local_79;
  expansion *local_78;
  expansion *local_70;
  expansion *local_68;
  expansion *local_60;
  expansion *local_58;
  expansion *local_50;
  expansion *local_48;
  allocator local_39;
  expansion *local_38;
  
  iVar15 = (uint)dim * 6;
  uVar10 = (ulong)((uint)dim * 0x30 + 0x10);
  lVar11 = -uVar10;
  peVar17 = (expansion *)((long)&local_158 + lVar11);
  peVar17->length_ = 0;
  *(index_t *)(local_138 + lVar11 + -0x1c) = iVar15;
  *(undefined8 *)((long)&dStack_160 + lVar11) = 0x15261e;
  local_60 = peVar17;
  local_58 = (expansion *)q1;
  local_38 = (expansion *)q0;
  GEO::expansion::assign_sq_dist(peVar17,p1,p0,dim);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  peVar17->capacity_ = iVar15;
  peVar17[-1].x_[1] = 6.84798206221322e-318;
  local_68 = peVar17;
  GEO::expansion::assign_sq_dist(peVar17,p2,p0,dim);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  peVar17->capacity_ = iVar15;
  peVar17[-1].x_[1] = 6.84821427306677e-318;
  p_sort[3] = (double *)peVar17;
  GEO::expansion::assign_sq_dist(peVar17,p3,p0,dim);
  local_48 = (expansion *)CONCAT44(local_48._4_4_,(uint)dim * 8);
  uVar10 = (ulong)((uint)dim << 6 | 0x10);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  peVar17->capacity_ = (uint)dim * 8;
  peVar18 = local_38;
  peVar17[-1].x_[1] = 6.84853541573656e-318;
  GEO::expansion::assign_dot_at(peVar17,p1,(double *)peVar18,p0,dim);
  peVar17[-1].x_[1] = 6.8486144662399e-318;
  local_50 = GEO::expansion::scale_fast(peVar17,2.0);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  iVar15 = (index_t)local_48;
  peVar17->capacity_ = (index_t)local_48;
  peVar18 = local_58;
  peVar17[-1].x_[1] = 6.84887138037574e-318;
  GEO::expansion::assign_dot_at(peVar17,p1,(double *)peVar18,p0,dim);
  peVar17[-1].x_[1] = 6.84895043087907e-318;
  peVar7 = GEO::expansion::scale_fast(peVar17,2.0);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  peVar17->capacity_ = iVar15;
  peVar17[-1].x_[1] = 6.84920240435845e-318;
  GEO::expansion::assign_dot_at(peVar17,p1,q2,p0,dim);
  peVar17[-1].x_[1] = 6.84928145486178e-318;
  local_70 = GEO::expansion::scale_fast(peVar17,2.0);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  iVar15 = (index_t)local_48;
  peVar17->capacity_ = (index_t)local_48;
  peVar18 = local_38;
  peVar17[-1].x_[1] = 6.84952354702825e-318;
  GEO::expansion::assign_dot_at(peVar17,p2,(double *)peVar18,p0,dim);
  peVar17[-1].x_[1] = 6.84960259753158e-318;
  local_78 = GEO::expansion::scale_fast(peVar17,2.0);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  peVar17->capacity_ = iVar15;
  peVar18 = local_58;
  peVar17[-1].x_[1] = 6.84984468969804e-318;
  GEO::expansion::assign_dot_at(peVar17,p2,(double *)peVar18,p0,dim);
  peVar17[-1].x_[1] = 6.84992374020138e-318;
  peVar8 = GEO::expansion::scale_fast(peVar17,2.0);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  peVar17->capacity_ = (index_t)local_48;
  peVar17[-1].x_[1] = 6.85014606974201e-318;
  GEO::expansion::assign_dot_at(peVar17,p2,q2,p0,dim);
  peVar17[-1].x_[1] = 6.85022512024534e-318;
  peVar9 = GEO::expansion::scale_fast(peVar17,2.0);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  iVar15 = (index_t)local_48;
  peVar17->capacity_ = (index_t)local_48;
  peVar18 = local_38;
  peVar17[-1].x_[1] = 6.85052155963285e-318;
  GEO::expansion::assign_dot_at(peVar17,p3,(double *)peVar18,p0,dim);
  peVar17[-1].x_[1] = 6.85060061013618e-318;
  a = GEO::expansion::scale_fast(peVar17,2.0);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  peVar17->capacity_ = iVar15;
  peVar18 = local_58;
  peVar17[-1].x_[1] = 6.85087234624139e-318;
  GEO::expansion::assign_dot_at(peVar17,p3,(double *)peVar18,p0,dim);
  peVar17[-1].x_[1] = 6.85095139674473e-318;
  a_00 = GEO::expansion::scale_fast(peVar17,2.0);
  peVar17 = (expansion *)((long)peVar17 - uVar10);
  peVar17->length_ = 0;
  peVar17->capacity_ = (index_t)local_48;
  peVar17[-1].x_[1] = 6.85122313284994e-318;
  GEO::expansion::assign_dot_at(peVar17,p3,q2,p0,dim);
  peVar17[-1].x_[1] = 6.85130218335328e-318;
  a_01 = GEO::expansion::scale_fast(peVar17,2.0);
  peVar20 = local_70;
  uVar1 = (local_70->length_ * peVar8->length_ + peVar9->length_ * peVar7->length_) * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar18 = (expansion *)((long)peVar17 - lVar12);
  local_38 = peVar18;
  peVar18->length_ = 0;
  peVar18->capacity_ = uVar1;
  peVar18[-1].x_[1] = 6.85185553687662e-318;
  GEO::expansion::assign_det2x2(peVar18,peVar7,peVar20,peVar8,peVar9);
  iVar15 = peVar8->length_;
  iVar2 = peVar9->length_;
  uVar10 = (ulong)(iVar15 + iVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  this = (expansion *)((long)peVar18 - uVar10);
  *(undefined4 *)((long)peVar18 - uVar10) = 0;
  this->capacity_ = iVar2 + iVar15;
  this[-1].x_[1] = 6.85219150151579e-318;
  GEO::expansion::assign_diff(this,peVar8,peVar9);
  iVar15 = peVar20->length_;
  iVar3 = peVar7->length_;
  uVar10 = (ulong)(iVar3 + iVar15 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  this_00 = (expansion *)((long)this - uVar10);
  *(undefined4 *)((long)this - uVar10) = 0;
  this_00->capacity_ = iVar3 + iVar15;
  this_00[-1].x_[1] = 6.8525225254985e-318;
  GEO::expansion::assign_diff(this_00,peVar20,peVar7);
  peVar16 = local_50;
  peVar18 = local_78;
  uVar1 = (iVar2 * local_50->length_ + iVar15 * local_78->length_) * 2;
  lVar11 = (ulong)uVar1 * 8 + 0x10;
  peVar22 = (expansion *)((long)this_00 - lVar11);
  peVar22->length_ = 0;
  peVar22->capacity_ = uVar1;
  peVar22[-1].x_[1] = 6.85299188786205e-318;
  GEO::expansion::assign_det2x2(peVar22,peVar20,peVar16,peVar9,peVar18);
  iVar15 = peVar9->length_;
  iVar2 = peVar18->length_;
  uVar10 = (ulong)(iVar15 + iVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  this_01 = (expansion *)((long)peVar22 - uVar10);
  *(undefined4 *)((long)peVar22 - uVar10) = 0;
  this_01->capacity_ = iVar2 + iVar15;
  this_01[-1].x_[1] = 6.85332785250122e-318;
  GEO::expansion::assign_diff(this_01,peVar9,peVar18);
  iVar15 = peVar16->length_;
  iVar3 = peVar20->length_;
  uVar10 = (ulong)(iVar3 + iVar15 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar18 = (expansion *)((long)this_01 - uVar10);
  *(undefined4 *)((long)this_01 - uVar10) = 0;
  peVar18->capacity_ = iVar3 + iVar15;
  local_58 = peVar18;
  peVar18[-1].x_[1] = 6.8536638171404e-318;
  GEO::expansion::assign_diff(peVar18,peVar16,peVar20);
  uVar1 = (iVar2 * peVar7->length_ + iVar15 * peVar8->length_) * 2;
  lVar21 = (ulong)uVar1 * 8 + 0x10;
  peVar20 = (expansion *)((long)peVar18 - lVar21);
  local_70 = peVar18;
  peVar20->length_ = 0;
  peVar20->capacity_ = uVar1;
  peVar18 = local_78;
  peVar20[-1].x_[1] = 6.85408871359582e-318;
  GEO::expansion::assign_det2x2(peVar20,peVar16,peVar7,peVar18,peVar8);
  iVar15 = peVar18->length_;
  iVar2 = peVar8->length_;
  uVar10 = (ulong)(iVar15 + iVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar9 = (expansion *)((long)peVar20 - uVar10);
  *(undefined4 *)((long)peVar20 - uVar10) = 0;
  peVar9->capacity_ = iVar2 + iVar15;
  peVar9[-1].x_[1] = 6.85440985626562e-318;
  GEO::expansion::assign_diff(peVar9,peVar18,peVar8);
  peVar18 = local_50;
  uVar1 = local_50->length_ + peVar7->length_;
  puVar14 = (uchar *)(ulong)uVar1;
  uVar10 = (ulong)(peVar7->length_ + local_50->length_ + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar8 = (expansion *)((long)peVar9 - uVar10);
  *(undefined4 *)((long)peVar9 - uVar10) = 0;
  peVar8->capacity_ = uVar1;
  local_48 = peVar8;
  peVar8[-1].x_[1] = 6.85474088024833e-318;
  GEO::expansion::assign_diff(peVar8,peVar7,peVar18);
  iVar5 = *(int *)((long)this_00 - lVar11) + *(int *)((long)peVar17 - lVar12);
  iVar6 = *(int *)((long)local_70 - lVar21);
  uVar10 = (ulong)(iVar6 + iVar5 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar16 = (expansion *)((long)peVar8 - uVar10);
  *(undefined4 *)((long)peVar8 - uVar10) = 0;
  peVar16->capacity_ = iVar5 + iVar6;
  peVar18 = local_38;
  local_78 = peVar20;
  local_50 = peVar22;
  peVar16[-1].x_[1] = 6.8552794118023e-318;
  GEO::expansion::assign_sum(peVar16,peVar18,peVar22,peVar20);
  peVar16[-1].x_[1] = 6.85535352164917e-318;
  iVar6 = GEO::expansion::sign
                    (peVar16,(EVP_PKEY_CTX *)peVar18,sig,(size_t *)peVar20,puVar14,(size_t)q1);
  peVar18 = local_60;
  local_70 = (expansion *)CONCAT44(local_70._4_4_,iVar6);
  if (iVar6 == 0) {
    peVar16[-1].x_[1] = 6.86683066660207e-318;
    std::__cxx11::string::string((string *)local_138,"Delta_sign != ZERO",&local_39);
    peVar16[-1].x_[1] = 6.86694430170061e-318;
    std::__cxx11::string::string
              ((string *)&local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,&local_79);
    peVar16[-1].x_[1] = (double)&LAB_00153555;
    GEO::geo_assertion_failed((string *)local_138,&local_158,0x4d25);
  }
  uVar1 = this->length_ * local_60->length_ * 2;
  lVar11 = (ulong)uVar1 * 8 + 0x10;
  peVar20 = (expansion *)((long)peVar16 - lVar11);
  peVar20->length_ = 0;
  peVar20->capacity_ = uVar1;
  peVar20[-1].x_[1] = 6.85572901154001e-318;
  GEO::expansion::assign_product(peVar20,this,peVar18);
  peVar18 = local_68;
  uVar1 = this_00->length_ * local_68->length_ * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar22 = (expansion *)((long)peVar20 - lVar12);
  peVar22->length_ = 0;
  peVar22->capacity_ = uVar1;
  peVar22[-1].x_[1] = 6.85605509486627e-318;
  GEO::expansion::assign_product(peVar22,this_00,peVar18);
  peVar18 = local_38;
  iVar6 = *(int *)((long)peVar20 - lVar12) + *(int *)((long)peVar16 - lVar11);
  iVar15 = local_38->length_;
  uVar10 = (ulong)(iVar15 + iVar6 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar17 = (expansion *)((long)peVar22 - uVar10);
  peVar17->length_ = 0;
  peVar17->capacity_ = iVar6 + iVar15;
  peVar17[-1].x_[1] = 6.85646516935232e-318;
  GEO::expansion::assign_sum(peVar17,peVar20,peVar22,peVar18);
  peVar18 = local_60;
  uVar1 = this_01->length_ * local_60->length_ * 2;
  lVar11 = (ulong)uVar1 * 8 + 0x10;
  peVar7 = (expansion *)((long)peVar17 - lVar11);
  local_38 = peVar17;
  peVar7->length_ = 0;
  peVar7->capacity_ = uVar1;
  peVar7[-1].x_[1] = 6.85677149005274e-318;
  GEO::expansion::assign_product(peVar7,this_01,peVar18);
  peVar20 = local_58;
  peVar18 = local_68;
  uVar1 = local_58->length_ * local_68->length_ * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar23 = (expansion *)((long)peVar7 - lVar12);
  peVar23->length_ = 0;
  peVar23->capacity_ = uVar1;
  peVar23[-1].x_[1] = 6.85705804812733e-318;
  GEO::expansion::assign_product(peVar23,peVar20,peVar18);
  peVar18 = local_50;
  iVar6 = *(int *)((long)peVar7 - lVar12) + *(int *)((long)local_38 - lVar11);
  iVar15 = local_50->length_;
  uVar13 = (ulong)(iVar15 + iVar6 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar20 = (expansion *)((long)peVar23 - uVar13);
  local_38 = peVar20;
  peVar20->length_ = 0;
  peVar20->capacity_ = iVar6 + iVar15;
  peVar20[-1].x_[1] = 6.85746812261337e-318;
  GEO::expansion::assign_sum(peVar20,peVar7,peVar23,peVar18);
  peVar18 = local_60;
  uVar1 = peVar9->length_ * local_60->length_ * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar8 = (expansion *)((long)peVar20 - lVar12);
  local_50 = peVar20;
  peVar8->length_ = 0;
  peVar8->capacity_ = uVar1;
  peVar8[-1].x_[1] = 6.8577744433138e-318;
  GEO::expansion::assign_product(peVar8,peVar9,peVar18);
  peVar20 = local_48;
  peVar18 = local_68;
  uVar1 = local_48->length_ * local_68->length_ * 2;
  lVar11 = (ulong)uVar1 * 8 + 0x10;
  peVar7 = (expansion *)((long)peVar8 - lVar11);
  peVar7->length_ = 0;
  peVar7->capacity_ = uVar1;
  peVar7[-1].x_[1] = 6.85805112007547e-318;
  GEO::expansion::assign_product(peVar7,peVar20,peVar18);
  peVar18 = local_78;
  iVar6 = *(int *)((long)peVar8 - lVar11) + *(int *)((long)local_50 - lVar12);
  iVar15 = local_78->length_;
  uVar19 = (ulong)(iVar15 + iVar6 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  this_02 = (expansion *)((long)peVar7 - uVar19);
  local_60 = peVar7;
  this_02->length_ = 0;
  this_02->capacity_ = iVar6 + iVar15;
  this_02[-1].x_[1] = 6.85842166930985e-318;
  GEO::expansion::assign_sum(this_02,peVar8,peVar7,peVar18);
  pdVar4 = p_sort[3];
  uVar1 = peVar16->length_ * *(int *)p_sort[3] * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar8 = (expansion *)((long)this_02 - lVar12);
  local_68 = this_02;
  peVar8->length_ = 0;
  peVar8->capacity_ = uVar1;
  peVar8[-1].x_[1] = 6.85873293066673e-318;
  GEO::expansion::assign_product(peVar8,peVar16,(expansion *)pdVar4);
  uVar1 = a->length_ * *(int *)((long)peVar22 - uVar10) * 2;
  lVar11 = (ulong)uVar1 * 8 + 0x10;
  peVar18 = (expansion *)((long)peVar8 - lVar11);
  *(undefined4 *)((long)peVar8 - lVar11) = 0;
  peVar18->capacity_ = uVar1;
  peVar18[-1].x_[1] = 6.85910842055757e-318;
  GEO::expansion::assign_product(peVar18,a,peVar17);
  peVar18[-1].x_[1] = 6.85914794580923e-318;
  local_50 = GEO::expansion::negate(peVar18);
  uVar1 = a_00->length_ * *(int *)((long)peVar23 - uVar13) * 2;
  lVar11 = (ulong)uVar1 * 8 + 0x10;
  peVar7 = (expansion *)((long)peVar18 - lVar11);
  *(undefined4 *)((long)peVar18 - lVar11) = 0;
  peVar7->capacity_ = uVar1;
  peVar18 = local_38;
  peVar7[-1].x_[1] = 6.85954319832591e-318;
  GEO::expansion::assign_product(peVar7,a_00,peVar18);
  peVar7[-1].x_[1] = 6.85958272357757e-318;
  peVar20 = GEO::expansion::negate(peVar7);
  uVar1 = a_01->length_ * *(int *)((long)local_60 - uVar19) * 2;
  lVar11 = (ulong)uVar1 * 8 + 0x10;
  peVar22 = (expansion *)((long)peVar7 - lVar11);
  *(undefined4 *)((long)peVar7 - lVar11) = 0;
  peVar22->capacity_ = uVar1;
  peVar22[-1].x_[1] = 6.85992856952966e-318;
  GEO::expansion::assign_product(peVar22,a_01,this_02);
  peVar22[-1].x_[1] = 6.85996809478133e-318;
  peVar7 = GEO::expansion::negate(peVar22);
  peVar18 = local_50;
  iVar6 = local_50->length_ + *(int *)((long)local_68 - lVar12) + peVar20->length_;
  iVar15 = peVar7->length_;
  uVar10 = (ulong)(iVar15 + iVar6 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar17 = (expansion *)((long)peVar22 - uVar10);
  *(undefined4 *)((long)peVar22 - uVar10) = 0;
  peVar17->capacity_ = iVar6 + iVar15;
  peVar17[-1].x_[1] = 6.86037322861092e-318;
  GEO::expansion::assign_sum(peVar17,peVar8,peVar18,peVar20,peVar7);
  peVar17[-1].x_[1] = 6.86041275386259e-318;
  iVar6 = GEO::expansion::sign
                    (peVar17,(EVP_PKEY_CTX *)peVar8,sig_00,(size_t *)peVar20,(uchar *)peVar7,
                     (size_t)q1);
  if (iVar6 == 0) {
    local_138 = (undefined1  [8])p0;
    p_sort[0] = p1;
    p_sort[1] = p2;
    p_sort[2] = p3;
    peVar17[-1].x_[1] = 6.86087223491322e-318;
    SOS_sort((double **)local_138,p_sort + 3,(uint)dim);
    peVar7 = (expansion *)0x0;
    peVar18 = local_58;
    peVar20 = local_48;
    do {
      if (peVar7 == (expansion *)0x4) {
        peVar17[-1].x_[1] = 6.86663304034373e-318;
        std::__cxx11::string::string
                  ((string *)&local_158,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                   ,&local_39);
        peVar17[-1].x_[1] = 6.86671703150352e-318;
        GEO::geo_should_not_have_reached(&local_158,0x4d73);
      }
      pdVar4 = p_sort[(long)((long)peVar7[-1].x_ + 0xf)];
      if (pdVar4 == p0) {
        iVar15 = this->length_;
        iVar2 = this_00->length_;
        uVar10 = (ulong)(iVar15 + iVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar18 = (expansion *)((long)peVar17 - uVar10);
        local_38 = peVar7;
        peVar18->length_ = 0;
        peVar18->capacity_ = iVar2 + iVar15;
        peVar18[-1].x_[1] = 6.86170720585469e-318;
        GEO::expansion::assign_sum(peVar18,this,this_00);
        uVar1 = a->length_ * *(int *)((long)peVar17 - uVar10) * 2;
        lVar11 = (ulong)uVar1 * 8 + 0x10;
        peVar7 = (expansion *)((long)peVar18 - lVar11);
        *(undefined4 *)((long)peVar18 - lVar11) = 0;
        peVar7->capacity_ = uVar1;
        peVar7[-1].x_[1] = 6.8620036452422e-318;
        GEO::expansion::assign_product(peVar7,a,peVar18);
        peVar7[-1].x_[1] = 6.86204317049386e-318;
        peVar20 = GEO::expansion::negate(peVar7);
        iVar15 = this_01->length_;
        iVar2 = local_58->length_;
        uVar10 = (ulong)(iVar15 + iVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar8 = (expansion *)((long)peVar7 - uVar10);
        peVar8->length_ = 0;
        peVar8->capacity_ = iVar2 + iVar15;
        peVar18 = local_58;
        peVar8[-1].x_[1] = 6.86238901644595e-318;
        GEO::expansion::assign_sum(peVar8,this_01,peVar18);
        uVar1 = a_00->length_ * *(int *)((long)peVar7 - uVar10) * 2;
        lVar11 = (ulong)uVar1 * 8 + 0x10;
        peVar17 = (expansion *)((long)peVar8 - lVar11);
        *(undefined4 *)((long)peVar8 - lVar11) = 0;
        peVar17->capacity_ = uVar1;
        peVar17[-1].x_[1] = 6.86269533714637e-318;
        GEO::expansion::assign_product(peVar17,a_00,peVar8);
        peVar17[-1].x_[1] = 6.86273486239804e-318;
        peVar22 = GEO::expansion::negate(peVar17);
        iVar15 = peVar9->length_;
        iVar2 = local_48->length_;
        uVar10 = (ulong)(iVar15 + iVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar7 = (expansion *)((long)peVar17 - uVar10);
        peVar7->length_ = 0;
        peVar7->capacity_ = iVar2 + iVar15;
        peVar18 = local_48;
        peVar7[-1].x_[1] = 6.86309058966305e-318;
        GEO::expansion::assign_sum(peVar7,peVar9,peVar18);
        uVar1 = a_01->length_ * *(int *)((long)peVar17 - uVar10) * 2;
        lVar11 = (ulong)uVar1 * 8 + 0x10;
        peVar18 = (expansion *)((long)peVar7 - lVar11);
        *(undefined4 *)((long)peVar7 - lVar11) = 0;
        peVar18->capacity_ = uVar1;
        peVar18[-1].x_[1] = 6.8634413762716e-318;
        GEO::expansion::assign_product(peVar18,a_01,peVar7);
        peVar18[-1].x_[1] = 6.86348090152326e-318;
        peVar8 = GEO::expansion::negate(peVar18);
        iVar6 = peVar20->length_ + peVar16->length_ + peVar22->length_;
        iVar15 = peVar8->length_;
        uVar10 = (ulong)(iVar15 + iVar6 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar17 = (expansion *)((long)peVar18 - uVar10);
        *(undefined4 *)((long)peVar18 - uVar10) = 0;
        peVar17->capacity_ = iVar6 + iVar15;
        peVar18 = local_58;
        peVar17[-1].x_[1] = 6.86387121338348e-318;
        peVar7 = peVar16;
        GEO::expansion::assign_sum(peVar17,peVar16,peVar20,peVar22,peVar8);
        puVar14 = extraout_RDX;
        peVar20 = local_48;
LAB_001534b8:
        peVar17[-1].x_[1] = 6.86631189767393e-318;
        iVar6 = GEO::expansion::sign
                          (peVar17,(EVP_PKEY_CTX *)peVar7,puVar14,(size_t *)peVar22,(uchar *)peVar8,
                           (size_t)q1);
        peVar7 = local_38;
        if (iVar6 != 0) break;
      }
      else {
        peVar8 = this;
        if (pdVar4 == p1) {
          uVar1 = a->length_ * this->length_ * 2;
          lVar12 = (ulong)uVar1 * 8 + 0x10;
          peVar18 = (expansion *)((long)peVar17 - lVar12);
          local_68 = peVar18;
          local_60 = peVar17;
          peVar18->length_ = 0;
          peVar18->capacity_ = uVar1;
          local_38 = peVar7;
          peVar18[-1].x_[1] = 6.86425658458723e-318;
          GEO::expansion::assign_product(peVar18,a,this);
          uVar1 = a_00->length_ * this_01->length_ * 2;
          lVar21 = (ulong)uVar1 * 8 + 0x10;
          peVar23 = (expansion *)((long)peVar18 - lVar21);
          local_50 = peVar18;
          peVar23->length_ = 0;
          peVar23->capacity_ = uVar1;
          peVar23[-1].x_[1] = 6.8645579646312e-318;
          GEO::expansion::assign_product(peVar23,a_00,this_01);
          uVar1 = a_01->length_ * peVar9->length_ * 2;
          lVar11 = (ulong)uVar1 * 8 + 0x10;
          peVar22 = (expansion *)((long)peVar23 - lVar11);
          local_78 = peVar23;
          peVar22->length_ = 0;
          peVar22->capacity_ = uVar1;
          peVar18 = peVar9;
LAB_0015344d:
          peVar22[-1].x_[1] = 6.86578324743288e-318;
          GEO::expansion::assign_product(peVar22,a_01,peVar18);
          peVar18 = local_58;
          iVar5 = *(int *)((long)local_50 - lVar21) + *(int *)((long)local_60 - lVar12);
          iVar6 = *(int *)((long)local_78 - lVar11);
          uVar10 = (ulong)(iVar6 + iVar5 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
          peVar17 = (expansion *)((long)peVar22 - uVar10);
          *(undefined4 *)((long)peVar22 - uVar10) = 0;
          peVar17->capacity_ = iVar5 + iVar6;
          peVar20 = local_48;
          peVar7 = local_68;
          peVar17[-1].x_[1] = 6.86627237242227e-318;
          GEO::expansion::assign_sum(peVar17,peVar7,peVar23,peVar22);
          puVar14 = extraout_RDX_00;
          goto LAB_001534b8;
        }
        if (pdVar4 == p2) {
          uVar1 = a->length_ * this_00->length_ * 2;
          lVar12 = (ulong)uVar1 * 8 + 0x10;
          peVar22 = (expansion *)((long)peVar17 - lVar12);
          local_68 = peVar22;
          local_60 = peVar17;
          peVar22->length_ = 0;
          peVar22->capacity_ = uVar1;
          local_38 = peVar7;
          peVar22[-1].x_[1] = 6.86517060603204e-318;
          GEO::expansion::assign_product(peVar22,a,this_00);
          uVar1 = a_00->length_ * peVar18->length_ * 2;
          lVar21 = (ulong)uVar1 * 8 + 0x10;
          peVar23 = (expansion *)((long)peVar22 - lVar21);
          local_50 = peVar22;
          peVar23->length_ = 0;
          peVar23->capacity_ = uVar1;
          peVar23[-1].x_[1] = 6.865471986076e-318;
          GEO::expansion::assign_product(peVar23,a_00,peVar18);
          uVar1 = a_01->length_ * peVar20->length_ * 2;
          lVar11 = (ulong)uVar1 * 8 + 0x10;
          peVar22 = (expansion *)((long)peVar23 - lVar11);
          local_78 = peVar23;
          peVar22->length_ = 0;
          peVar22->capacity_ = uVar1;
          peVar18 = local_48;
          goto LAB_0015344d;
        }
        if (pdVar4 == p3) {
          peVar17[-1].x_[1] = -NAN;
          return SUB84(peVar17[-1].x_[1],0);
        }
      }
      peVar7 = (expansion *)((long)&peVar7->length_ + 1);
    } while( true );
  }
  return iVar6 * (int)local_70;
}

Assistant:

Sign side3_exact_SOS(
        const double* p0, const double* p1, const double* p2, const double* p3,
        const double* q0, const double* q1, const double* q2,
        coord_index_t dim
    ) {
        PCK_STAT(cnt_side3_exact++);

        const expansion& l1 = expansion_sq_dist(p1, p0, dim);
        const expansion& l2 = expansion_sq_dist(p2, p0, dim);
        const expansion& l3 = expansion_sq_dist(p3, p0, dim);

        const expansion& a10 = expansion_dot_at(p1,q0,p0, dim).scale_fast(2.0);
        const expansion& a11 = expansion_dot_at(p1,q1,p0, dim).scale_fast(2.0);
        const expansion& a12 = expansion_dot_at(p1,q2,p0, dim).scale_fast(2.0);
        const expansion& a20 = expansion_dot_at(p2,q0,p0, dim).scale_fast(2.0);
        const expansion& a21 = expansion_dot_at(p2,q1,p0, dim).scale_fast(2.0);
        const expansion& a22 = expansion_dot_at(p2,q2,p0, dim).scale_fast(2.0);

        const expansion& a30 = expansion_dot_at(p3,q0,p0, dim).scale_fast(2.0);
        const expansion& a31 = expansion_dot_at(p3,q1,p0, dim).scale_fast(2.0);
        const expansion& a32 = expansion_dot_at(p3,q2,p0, dim).scale_fast(2.0);

        // [ b00 b01 b02 ]           [  1   1   1  ]-1
        // [ b10 b11 b12 ] = Delta * [ a10 a11 a12 ]
        // [ b20 b21 b22 ]           [ a20 a21 a22 ]

        const expansion& b00 = expansion_det2x2(a11, a12, a21, a22);
        const expansion& b01 = expansion_diff(a21, a22);
        const expansion& b02 = expansion_diff(a12, a11);
        const expansion& b10 = expansion_det2x2(a12, a10, a22, a20);
        const expansion& b11 = expansion_diff(a22, a20);
        const expansion& b12 = expansion_diff(a10, a12);
        const expansion& b20 = expansion_det2x2(a10, a11, a20, a21);
        const expansion& b21 = expansion_diff(a20, a21);
        const expansion& b22 = expansion_diff(a11, a10);

        const expansion& Delta = expansion_sum3(b00, b10, b20);
        Sign Delta_sign = Delta.sign();
        // Should not occur with symbolic
        // perturbation done at previous steps.
        geo_assert(Delta_sign != ZERO);

        //       [ Lambda0 ]   [ b01 b02 ]   [ l1 ]   [ b00 ]
        // Delta [ Lambda1 ] = [ b11 b12 ] * [    ] + [ b10 ]
        //       [ Lambda2 ]   [ b21 b22 ]   [ l2 ]   [ b20 ]

        const expansion& b01_l1 = expansion_product(b01, l1);
        const expansion& b02_l2 = expansion_product(b02, l2);
        const expansion& DeltaLambda0 = expansion_sum3(b01_l1, b02_l2, b00);

        const expansion& b11_l1 = expansion_product(b11, l1);
        const expansion& b12_l2 = expansion_product(b12, l2);
        const expansion& DeltaLambda1 = expansion_sum3(b11_l1, b12_l2, b10);

        const expansion& b21_l1 = expansion_product(b21, l1);
        const expansion& b22_l2 = expansion_product(b22, l2);
        const expansion& DeltaLambda2 = expansion_sum3(b21_l1, b22_l2, b20);

        // r = Delta*l3-(a30*DeltaLambda0+a31*DeltaLambda1+a32*DeltaLambda2)

        const expansion& r0 = expansion_product(Delta, l3);
        const expansion& r1 = expansion_product(a30, DeltaLambda0).negate();
        const expansion& r2 = expansion_product(a31, DeltaLambda1).negate();
        const expansion& r3 = expansion_product(a32, DeltaLambda2).negate();
        const expansion& r = expansion_sum4(r0, r1, r2, r3);
        Sign r_sign = r.sign();

        // Statistics
        PCK_STAT(len_side3_num = std::max(len_side3_num, r.length()));
        PCK_STAT(len_side3_denom = std::max(len_side3_denom, Delta.length()));

        // Simulation of Simplicity (symbolic perturbation)
        if(r_sign == ZERO) {
            PCK_STAT(cnt_side3_SOS++);
            const double* p_sort[4];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            SOS_sort(p_sort, p_sort + 4, dim);
            for(index_t i = 0; i < 4; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1_0 = expansion_sum(b01, b02);
                    const expansion& z1 = expansion_product(a30, z1_0).negate();
                    const expansion& z2_0 = expansion_sum(b11, b12);
                    const expansion& z2 = expansion_product(a31, z2_0).negate();
                    const expansion& z3_0 = expansion_sum(b21, b22);
                    const expansion& z3 = expansion_product(a32, z3_0).negate();
                    const expansion& z = expansion_sum4(Delta, z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    const expansion& z1 = expansion_product(a30, b01);
                    const expansion& z2 = expansion_product(a31, b11);
                    const expansion& z3 = expansion_product(a32, b21);
                    const expansion& z = expansion_sum3(z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p2) {
                    const expansion& z1 = expansion_product(a30, b02);
                    const expansion& z2 = expansion_product(a31, b12);
                    const expansion& z3 = expansion_product(a32, b22);
                    const expansion& z = expansion_sum3(z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p3) {
                    return NEGATIVE;
                }
            }
            geo_assert_not_reached;
        }
        return Sign(Delta_sign * r_sign);
    }